

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O0

void __thiscall
oout::ContainTest::ContainTest<std::shared_ptr<oout::ContainMatch>>
          (ContainTest *this,shared_ptr<const_oout::Text> *text,string *sub,
          shared_ptr<oout::ContainMatch> *subs)

{
  undefined1 local_58 [16];
  shared_ptr<const_oout::Match> local_48;
  shared_ptr<const_oout::Match> local_38;
  shared_ptr<oout::ContainMatch> *local_28;
  shared_ptr<oout::ContainMatch> *subs_local;
  string *sub_local;
  shared_ptr<const_oout::Text> *text_local;
  ContainTest *this_local;
  
  local_28 = subs;
  subs_local = (shared_ptr<oout::ContainMatch> *)sub;
  sub_local = (string *)text;
  text_local = (shared_ptr<const_oout::Text> *)this;
  std::shared_ptr<oout::Match_const>::shared_ptr<oout::ContainMatch,void>
            ((shared_ptr<oout::Match_const> *)&local_38,subs);
  std::make_shared<oout::ContainMatch,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::shared_ptr<oout::Match_const>::shared_ptr<oout::ContainMatch,void>
            ((shared_ptr<oout::Match_const> *)&local_48,(shared_ptr<oout::ContainMatch> *)local_58);
  ContainTest<>(this,text,&local_38,&local_48);
  std::shared_ptr<const_oout::Match>::~shared_ptr(&local_48);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr((shared_ptr<oout::ContainMatch> *)local_58);
  std::shared_ptr<const_oout::Match>::~shared_ptr(&local_38);
  return;
}

Assistant:

ContainTest(
		const std::shared_ptr<const Text> &text,
		const std::string &sub,
		S ... subs
	) : ContainTest(text, subs..., std::make_shared<ContainMatch>(sub))
	{
	}